

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::HeapDisposer<kj::TaskSet::Task>::disposeImpl
          (HeapDisposer<kj::TaskSet::Task> *this,void *pointer)

{
  long *plVar1;
  
  if (pointer != (void *)0x0) {
    plVar1 = *(long **)((long)pointer + 0x50);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x50) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x48))
                (*(undefined8 **)((long)pointer + 0x48),(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    plVar1 = *(long **)((long)pointer + 0x30);
    if (plVar1 != (long *)0x0) {
      *(undefined8 *)((long)pointer + 0x30) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x28))
                (*(undefined8 **)((long)pointer + 0x28),(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    Event::~Event((Event *)pointer);
    operator_delete(pointer,0x58);
    return;
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }